

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O3

void __thiscall
btAxisSweep3Internal<unsigned_int>::sortMinUp
          (btAxisSweep3Internal<unsigned_int> *this,int axis,uint edge,btDispatcher *dispatcher,
          bool updateOverlaps)

{
  int *piVar1;
  btOverlappingPairCallback *pbVar2;
  uint uVar3;
  ulong uVar4;
  Edge EVar5;
  Edge *pEVar6;
  Handle *handle1;
  Handle *pHVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  int *piVar11;
  Handle *pHVar12;
  long lVar13;
  
  lVar10 = (long)axis;
  uVar3 = this->m_pEdges[lVar10][(ulong)edge + 1].m_handle;
  if (uVar3 != 0) {
    pEVar6 = this->m_pEdges[lVar10] + edge;
    uVar9 = 1 << ((byte)axis & 0x1f) & 3;
    EVar5.m_handle = 0;
    EVar5.m_pos = pEVar6->m_pos;
    uVar8 = 1 << (sbyte)uVar9 & 3;
    piVar11 = (int *)((long)(&this->m_pHandles[pEVar6->m_handle].super_btBroadphaseProxy.m_aabbMax +
                            1) + lVar10 * 4);
    do {
      if (EVar5.m_pos < pEVar6[1].m_pos) {
        return;
      }
      pHVar7 = this->m_pHandles + uVar3;
      lVar13 = 0x3c;
      if (((((pEVar6[1].m_pos & 1) != 0) && (lVar13 = 0x48, updateOverlaps)) &&
          (pHVar12 = this->m_pHandles + pEVar6->m_handle,
          *(uint *)((long)(&(pHVar7->super_btBroadphaseProxy).m_aabbMax + 1) + (ulong)(uVar9 * 4))
          <= *(uint *)((long)pHVar12->m_maxEdges + (ulong)(uVar9 * 4)))) &&
         (((*(uint *)((long)(&(pHVar12->super_btBroadphaseProxy).m_aabbMax + 1) + (ulong)(uVar9 * 4)
                     ) <= *(uint *)((long)pHVar7->m_maxEdges + (ulong)(uVar9 * 4)) &&
           (uVar4 = (ulong)(uVar8 * 4),
           *(uint *)((long)(&(pHVar7->super_btBroadphaseProxy).m_aabbMax + 1) + uVar4) <=
           *(uint *)((long)pHVar12->m_maxEdges + uVar4))) &&
          (uVar4 = (ulong)(uVar8 * 4),
          *(uint *)((long)(&(pHVar12->super_btBroadphaseProxy).m_aabbMax + 1) + uVar4) <=
          *(uint *)((long)pHVar7->m_maxEdges + uVar4))))) {
        (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[3])
                  (this->m_pairCache,pHVar12,pHVar7,dispatcher);
        pbVar2 = this->m_userPairCallback;
        if (pbVar2 != (btOverlappingPairCallback *)0x0) {
          (*pbVar2->_vptr_btOverlappingPairCallback[3])(pbVar2,pHVar12,pHVar7,dispatcher);
        }
      }
      piVar1 = (int *)((long)(pHVar7->super_btBroadphaseProxy).m_aabbMin.m_floats +
                      lVar10 * 4 + lVar13 + -0x1c);
      *piVar1 = *piVar1 + -1;
      *piVar11 = *piVar11 + 1;
      EVar5 = *pEVar6;
      *pEVar6 = pEVar6[1];
      pEVar6[1] = EVar5;
      uVar3 = pEVar6[2].m_handle;
      pEVar6 = pEVar6 + 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::sortMinUp(int axis, BP_FP_INT_TYPE edge, btDispatcher* dispatcher, bool updateOverlaps)
{
	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pNext = pEdge + 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pNext->m_handle && (pEdge->m_pos >= pNext->m_pos))
	{
		Handle* pHandleNext = getHandle(pNext->m_handle);

		if (pNext->IsMax())
		{
			Handle* handle0 = getHandle(pEdge->m_handle);
			Handle* handle1 = getHandle(pNext->m_handle);
			const int axis1 = (1  << axis) & 3;
			const int axis2 = (1  << axis1) & 3;
			
			// if next edge is maximum remove any overlap between the two handles
			if (updateOverlaps 
#ifdef USE_OVERLAP_TEST_ON_REMOVES
				&& testOverlap2D(handle0,handle1,axis1,axis2)
#endif //USE_OVERLAP_TEST_ON_REMOVES
				)
			{
				

				m_pairCache->removeOverlappingPair(handle0,handle1,dispatcher);	
				if (m_userPairCallback)
					m_userPairCallback->removeOverlappingPair(handle0,handle1,dispatcher);
				
			}


			// update edge reference in other handle
			pHandleNext->m_maxEdges[axis]--;
		}
		else
			pHandleNext->m_minEdges[axis]--;

		pHandleEdge->m_minEdges[axis]++;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pNext;
		*pNext = swap;

		// increment
		pEdge++;
		pNext++;
	}